

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
jessilib::make_json_string<wchar_t,char>
          (jessilib *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out_string,
          u8string_view in_string)

{
  char32_t __val;
  char8_t *extraout_RDX;
  size_t sVar1;
  char8_t *extraout_RDX_00;
  char8_t *extraout_RDX_01;
  char8_t *extraout_RDX_02;
  size_type __n;
  char8_t *extraout_RDX_03;
  char8_t *pcVar2;
  char8_t *extraout_RDX_04;
  char8_t *extraout_RDX_05;
  long lVar3;
  size_t sVar4;
  decode_result dVar5;
  __integer_to_chars_result_type<unsigned_int> _Var6;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_00;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_01;
  char data [2];
  wchar_t codepoint;
  undefined1 local_3e [2];
  char32_t local_3c;
  size_t local_38;
  
  sVar4 = in_string._M_len;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (long)&(out_string->_M_dataplus)._M_p + *(long *)(this + 8) + 2);
  local_3c = L'\"';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (char *)&local_3c,4);
  in_string_00._M_str = extraout_RDX;
  in_string_00._M_len = sVar4;
  dVar5 = decode_codepoint_utf8<char8_t>((jessilib *)out_string,in_string_00);
  sVar1 = dVar5.units;
  if (sVar1 != 0) {
    __val = dVar5.codepoint;
    do {
      if (__val == L'\\') {
        lVar3 = 0;
        do {
          local_3c = (char32_t)(byte)"\\\\"[lVar3];
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)&local_3c,4);
          lVar3 = lVar3 + 1;
          pcVar2 = extraout_RDX_01;
        } while (lVar3 != 2);
      }
      else if (__val == L'\"') {
        lVar3 = 0;
        do {
          local_3c = (char32_t)(byte)"\\\""[lVar3];
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)&local_3c,4);
          lVar3 = lVar3 + 1;
          pcVar2 = extraout_RDX_00;
        } while (lVar3 != 2);
      }
      else if ((uint)__val < 0x20) {
        lVar3 = 0;
        local_38 = sVar1;
        do {
          local_3c = (char32_t)(byte)"\\u00"[lVar3];
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)&local_3c,4);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        if (__val == L'\0') {
          local_3e[0] = 0x30;
LAB_0019214b:
          local_3c = L'0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)&local_3c,4);
          local_3c = (char32_t)local_3e[0];
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)&local_3c,4);
          pcVar2 = extraout_RDX_02;
          sVar1 = local_38;
        }
        else {
          _Var6 = std::__detail::__to_chars_16<unsigned_int>(local_3e,(char *)&local_3c,__val);
          sVar1 = local_38;
          if (_Var6.ptr == local_3e) {
            lVar3 = 0;
            do {
              local_3c = (char32_t)(byte)"\\u00"[lVar3 + 2];
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)&local_3c,4);
              lVar3 = lVar3 + 1;
              pcVar2 = extraout_RDX_05;
            } while (lVar3 != 2);
          }
          else {
            if ((char32_t *)_Var6.ptr != &local_3c) goto LAB_0019214b;
            lVar3 = 0;
            do {
              local_3c = (char32_t)(byte)local_3e[lVar3];
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)&local_3c,4);
              lVar3 = lVar3 + 1;
              pcVar2 = extraout_RDX_04;
            } while (lVar3 != 2);
          }
        }
      }
      else {
        if ((uint)__val < 0x110000) {
          __n = 4;
          local_3c = __val;
        }
        else {
          __n = 0;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char *)&local_3c,__n);
        pcVar2 = extraout_RDX_03;
      }
      sVar4 = sVar4 + sVar1;
      out_string = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)out_string - sVar1);
      in_string_01._M_str = pcVar2;
      in_string_01._M_len = sVar4;
      dVar5 = decode_codepoint_utf8<char8_t>((jessilib *)out_string,in_string_01);
      sVar1 = dVar5.units;
      __val = dVar5.codepoint;
    } while (sVar1 != 0);
  }
  local_3c = L'\"';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (char *)&local_3c,4);
  return;
}

Assistant:

void make_json_string(std::basic_string<ResultCharT>& out_string, std::u8string_view in_string) {
	using namespace std::literals;
	out_string.reserve(out_string.size() + in_string.size() + 2);
	simple_append<CharT, ResultCharT>(out_string, '\"');

	decode_result decode;
	while ((decode = decode_codepoint(in_string)).units != 0) {
		if (decode.codepoint == U'\\') { // backslash
			simple_append<CharT, ResultCharT>(out_string, u8"\\\\"sv);
		}
		else if (decode.codepoint == U'\"') { // quotation
			simple_append<CharT, ResultCharT>(out_string, u8"\\\""sv);
		}
		else if (decode.codepoint < 0x20) { // control characters
			simple_append<CharT, ResultCharT>(out_string, u8"\\u00"sv);

			// overwrite last 2 zeroes with correct hexadecimal sequence
			char data[2]; // Will only ever use 2 chars
			char* data_end = data + sizeof(data);
			auto to_chars_result = std::to_chars(data, data_end, static_cast<uint32_t>(decode.codepoint), 16);
			if (to_chars_result.ptr == data) {
				// No bytes written
				simple_append<CharT, ResultCharT>(out_string, u8"00"sv);
			}
			else if (to_chars_result.ptr != data_end) {
				// 1 byte written
				simple_append<CharT, ResultCharT>(out_string, '0');
				simple_append<CharT, ResultCharT>(out_string, data[0]);
			}
			else {
				// 2 bytes written
				simple_append<CharT, ResultCharT>(out_string, std::u8string_view{ reinterpret_cast<char8_t*>(data), sizeof(data) });
			}
		}
		else {
			if constexpr (sizeof(CharT) == sizeof(char8_t) && sizeof(CharT) == sizeof(ResultCharT)) {
				// Valid UTF-8 sequence; copy it over
				out_string.append(reinterpret_cast<const ResultCharT*>(in_string.data()), decode.units);
			}
			else if constexpr (sizeof(CharT) == sizeof(ResultCharT)){
				// Valid UTF-8 codepoint; append it
				encode_codepoint(out_string, decode.codepoint);
			}
			else {
				// Valid UTF-8 codepoint; encode & append it
				encode_buffer_type<CharT> buffer;
				size_t units_written = encode_codepoint(buffer, decode.codepoint);
				out_string.append(reinterpret_cast<ResultCharT*>(buffer), units_written * sizeof(CharT));
			}
		}

		in_string.remove_prefix(decode.units);
	}

	simple_append<CharT, ResultCharT>(out_string, '\"');
}